

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingFetchRow<int>
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  data_ptr_t pdVar1;
  int iVar2;
  unsigned_long skip_count;
  int multiplier;
  BitpackingScanState<int,_int> scan_state;
  
  BitpackingScanState<int,_int>::BitpackingScanState(&scan_state,segment);
  skip_count = NumericCastImpl<unsigned_long,_long,_false>::Convert(row_id);
  BitpackingScanState<int,_int>::Skip(&scan_state,segment,skip_count);
  pdVar1 = result->data;
  if (scan_state.current_group.mode == CONSTANT_DELTA) {
    TryCast::Operation<unsigned_long,int>(scan_state.current_group_offset,&multiplier,false);
    scan_state.current_constant =
         scan_state.current_constant * multiplier + scan_state.current_frame_of_reference;
  }
  else if (scan_state.current_group.mode != CONSTANT) {
    BitpackingPrimitives::UnPackGroup<int>
              ((data_ptr_t)scan_state.decompression_buffer,
               scan_state.current_group_ptr +
               ((ulong)scan_state.current_width *
                (scan_state.current_group_offset & 0xffffffffffffffe0) >> 3),
               scan_state.current_width,true);
    iVar2 = scan_state.decompression_buffer[(uint)scan_state.current_group_offset & 0x1f];
    *(int *)(pdVar1 + result_idx * 4) = iVar2;
    iVar2 = iVar2 + scan_state.current_frame_of_reference;
    *(int *)(pdVar1 + result_idx * 4) = iVar2;
    if (scan_state.current_group.mode != DELTA_FOR) goto LAB_014e961d;
    scan_state.current_constant = iVar2 + scan_state.current_delta_offset;
  }
  *(int *)(pdVar1 + result_idx * 4) = scan_state.current_constant;
LAB_014e961d:
  BitpackingScanState<int,_int>::~BitpackingScanState(&scan_state);
  return;
}

Assistant:

void BitpackingFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result,
                        idx_t result_idx) {
	BitpackingScanState<T> scan_state(segment);
	scan_state.Skip(segment, NumericCast<idx_t>(row_id));

	D_ASSERT(scan_state.current_group_offset < BITPACKING_METADATA_GROUP_SIZE);

	D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
	T *result_data = FlatVector::GetData<T>(result);
	T *current_result_ptr = result_data + result_idx;

	idx_t offset_in_compression_group =
	    scan_state.current_group_offset % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;

	data_ptr_t decompression_group_start_pointer =
	    scan_state.current_group_ptr +
	    (scan_state.current_group_offset - offset_in_compression_group) * scan_state.current_width / 8;

	//! Because FOR offsets all our values to be 0 or above, we can always skip sign extension here
	bool skip_sign_extend = true;

	if (scan_state.current_group.mode == BitpackingMode::CONSTANT) {
		*current_result_ptr = scan_state.current_constant;
		return;
	}

	if (scan_state.current_group.mode == BitpackingMode::CONSTANT_DELTA) {
		T multiplier;
		auto cast = TryCast::Operation<idx_t, T>(scan_state.current_group_offset, multiplier);
		(void)cast;
		D_ASSERT(cast);
#ifdef DEBUG
		// overflow check
		T result;
		bool multiply = TryMultiplyOperator::Operation(multiplier, scan_state.current_constant, result);
		bool add = TryAddOperator::Operation(result, scan_state.current_frame_of_reference, result);
		D_ASSERT(multiply && add);
#endif
		*current_result_ptr = (multiplier * scan_state.current_constant) + scan_state.current_frame_of_reference;
		return;
	}

	D_ASSERT(scan_state.current_group.mode == BitpackingMode::FOR ||
	         scan_state.current_group.mode == BitpackingMode::DELTA_FOR);

	BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(scan_state.decompression_buffer),
	                                     decompression_group_start_pointer, scan_state.current_width, skip_sign_extend);

	*current_result_ptr = scan_state.decompression_buffer[offset_in_compression_group];
	*current_result_ptr += scan_state.current_frame_of_reference;

	if (scan_state.current_group.mode == BitpackingMode::DELTA_FOR) {
		*current_result_ptr += scan_state.current_delta_offset;
	}
}